

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_highbd_dr_prediction_z1_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  int in_EDX;
  int in_stack_00000100;
  int in_stack_00000104;
  uint16_t *in_stack_00000108;
  ptrdiff_t in_stack_00000110;
  uint16_t *in_stack_00000118;
  int in_stack_00000124;
  int in_stack_000001f8;
  int in_stack_000001fc;
  uint16_t *in_stack_00000200;
  ptrdiff_t in_stack_00000208;
  uint16_t *in_stack_00000210;
  int in_stack_00000218;
  int in_stack_0000021c;
  uint16_t *in_stack_00000220;
  ptrdiff_t in_stack_00000228;
  uint16_t *in_stack_00000230;
  int in_stack_0000023c;
  int in_stack_00000298;
  int in_stack_0000029c;
  uint16_t *in_stack_000002a0;
  ptrdiff_t in_stack_000002a8;
  uint16_t *in_stack_000002b0;
  int in_stack_000002b8;
  int in_stack_00000818;
  int in_stack_0000081c;
  uint16_t *in_stack_00000820;
  ptrdiff_t in_stack_00000828;
  uint16_t *in_stack_00000830;
  int in_stack_0000083c;
  int in_stack_00001038;
  int in_stack_0000103c;
  uint16_t *in_stack_00001040;
  ptrdiff_t in_stack_00001048;
  uint16_t *in_stack_00001050;
  int in_stack_0000105c;
  int in_stack_ffffffffffffffd0;
  
  if (in_EDX == 4) {
    highbd_dr_prediction_z1_4xN_avx2
              (in_stack_00000124,in_stack_00000118,in_stack_00000110,in_stack_00000108,
               in_stack_00000104,in_stack_00000100,in_stack_ffffffffffffffd0);
  }
  else if (in_EDX == 8) {
    highbd_dr_prediction_z1_8xN_avx2
              (in_stack_0000023c,in_stack_00000230,in_stack_00000228,in_stack_00000220,
               in_stack_0000021c,in_stack_00000218,in_stack_ffffffffffffffd0);
  }
  else if (in_EDX == 0x10) {
    highbd_dr_prediction_z1_16xN_avx2
              (in_stack_0000083c,in_stack_00000830,in_stack_00000828,in_stack_00000820,
               in_stack_0000081c,in_stack_00000818,in_stack_ffffffffffffffd0);
  }
  else if (in_EDX == 0x20) {
    highbd_dr_prediction_z1_32xN_avx2
              (in_stack_0000105c,in_stack_00001050,in_stack_00001048,in_stack_00001040,
               in_stack_0000103c,in_stack_00001038,in_stack_ffffffffffffffd0);
  }
  else if (in_EDX == 0x40) {
    if (bh < 0xc) {
      highbd_dr_prediction_z1_64xN_avx2
                (in_stack_0000021c,in_stack_00000210,in_stack_00000208,in_stack_00000200,
                 in_stack_000001fc,in_stack_000001f8);
    }
    else {
      highbd_dr_prediction_32bit_z1_64xN_avx2
                (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                 in_stack_0000029c,in_stack_00000298);
    }
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z1_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int dx, int dy, int bd) {
  (void)left;
  (void)dy;

  switch (bw) {
    case 4:
      highbd_dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 8:
      highbd_dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 16:
      highbd_dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 32:
      highbd_dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 64:
      if (bd < 12) {
        highbd_dr_prediction_z1_64xN_avx2(bh, dst, stride, above,
                                          upsample_above, dx);
      } else {
        highbd_dr_prediction_32bit_z1_64xN_avx2(bh, dst, stride, above,
                                                upsample_above, dx);
      }
      break;
    default: break;
  }
  return;
}